

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void rf_unload_mesh(rf_mesh mesh,rf_allocator allocator)

{
  rf_source_location rVar1;
  rf_source_location rVar2;
  rf_source_location rVar3;
  rf_source_location rVar4;
  rf_source_location rVar5;
  rf_source_location rVar6;
  rf_source_location rVar7;
  rf_source_location rVar8;
  rf_source_location rVar9;
  rf_source_location rVar10;
  rf_source_location rVar11;
  rf_source_location rVar12;
  rf_mesh mesh_00;
  rf_allocator_args rVar13;
  rf_allocator_args rVar14;
  rf_allocator_args rVar15;
  rf_allocator_args rVar16;
  rf_allocator_args rVar17;
  rf_allocator_args rVar18;
  rf_allocator_args rVar19;
  rf_allocator_args rVar20;
  rf_allocator_args rVar21;
  rf_allocator_args rVar22;
  rf_allocator_args rVar23;
  rf_allocator_args rVar24;
  long lVar25;
  rf_mesh *prVar26;
  undefined8 *puVar27;
  undefined8 in_stack_fffffffffffffd10;
  undefined8 in_stack_fffffffffffffd18;
  undefined8 in_stack_fffffffffffffd20;
  undefined8 in_stack_fffffffffffffd28;
  undefined8 in_stack_fffffffffffffd30;
  undefined1 in_stack_fffffffffffffd38 [72];
  uint uStack_26c;
  uint uStack_23c;
  uint uStack_20c;
  uint uStack_1dc;
  uint uStack_1ac;
  uint uStack_17c;
  uint uStack_14c;
  uint uStack_11c;
  uint uStack_ec;
  uint uStack_bc;
  uint uStack_8c;
  uint uStack_5c;
  rf_allocator allocator_local;
  
  allocator_local.user_data = allocator.user_data;
  prVar26 = &mesh;
  puVar27 = (undefined8 *)&stack0xfffffffffffffd08;
  allocator_local.allocator_proc = allocator.allocator_proc;
  for (lVar25 = 0xe; lVar25 != 0; lVar25 = lVar25 + -1) {
    *puVar27 = *(undefined8 *)prVar26;
    prVar26 = (rf_mesh *)&prVar26->vertices;
    puVar27 = puVar27 + 1;
  }
  mesh_00.vertices = (float *)in_stack_fffffffffffffd18;
  mesh_00.vertex_count = (int)in_stack_fffffffffffffd10;
  mesh_00.triangle_count = (int)((ulong)in_stack_fffffffffffffd10 >> 0x20);
  mesh_00.texcoords = (float *)in_stack_fffffffffffffd20;
  mesh_00.texcoords2 = (float *)in_stack_fffffffffffffd28;
  mesh_00.normals = (float *)in_stack_fffffffffffffd30;
  mesh_00.tangents = (float *)in_stack_fffffffffffffd38._0_8_;
  mesh_00.colors = (uchar *)in_stack_fffffffffffffd38._8_8_;
  mesh_00.indices = (unsigned_short *)in_stack_fffffffffffffd38._16_8_;
  mesh_00.anim_vertices = (float *)in_stack_fffffffffffffd38._24_8_;
  mesh_00.anim_normals = (float *)in_stack_fffffffffffffd38._32_8_;
  mesh_00.bone_ids = (int *)in_stack_fffffffffffffd38._40_8_;
  mesh_00.bone_weights = (float *)in_stack_fffffffffffffd38._48_8_;
  mesh_00.vao_id = in_stack_fffffffffffffd38._56_4_;
  mesh_00._100_4_ = in_stack_fffffffffffffd38._60_4_;
  mesh_00.vbo_id = (uint *)in_stack_fffffffffffffd38._64_8_;
  rf_gfx_unload_mesh(mesh_00);
  rVar1.proc_name = "rf_unload_mesh";
  rVar1.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar1.line_in_file = 0x81fa;
  rVar13.size_to_allocate_or_reallocate = 0;
  rVar13.pointer_to_free_or_realloc = mesh.vertices;
  rVar13._16_8_ = (ulong)uStack_5c << 0x20;
  (*allocator.allocator_proc)(&allocator_local,rVar1,RF_AM_FREE,rVar13);
  rVar2.proc_name = "rf_unload_mesh";
  rVar2.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar2.line_in_file = 0x81fb;
  rVar14.size_to_allocate_or_reallocate = 0;
  rVar14.pointer_to_free_or_realloc = mesh.texcoords;
  rVar14._16_8_ = (ulong)uStack_8c << 0x20;
  (*allocator_local.allocator_proc)(&allocator_local,rVar2,RF_AM_FREE,rVar14);
  rVar3.proc_name = "rf_unload_mesh";
  rVar3.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar3.line_in_file = 0x81fc;
  rVar15.size_to_allocate_or_reallocate = 0;
  rVar15.pointer_to_free_or_realloc = mesh.normals;
  rVar15._16_8_ = (ulong)uStack_bc << 0x20;
  (*allocator_local.allocator_proc)(&allocator_local,rVar3,RF_AM_FREE,rVar15);
  rVar4.proc_name = "rf_unload_mesh";
  rVar4.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar4.line_in_file = 0x81fd;
  rVar16.size_to_allocate_or_reallocate = 0;
  rVar16.pointer_to_free_or_realloc = mesh.colors;
  rVar16._16_8_ = (ulong)uStack_ec << 0x20;
  (*allocator_local.allocator_proc)(&allocator_local,rVar4,RF_AM_FREE,rVar16);
  rVar5.proc_name = "rf_unload_mesh";
  rVar5.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar5.line_in_file = 0x81fe;
  rVar17.size_to_allocate_or_reallocate = 0;
  rVar17.pointer_to_free_or_realloc = mesh.tangents;
  rVar17._16_8_ = (ulong)uStack_11c << 0x20;
  (*allocator_local.allocator_proc)(&allocator_local,rVar5,RF_AM_FREE,rVar17);
  rVar6.proc_name = "rf_unload_mesh";
  rVar6.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar6.line_in_file = 0x81ff;
  rVar18.size_to_allocate_or_reallocate = 0;
  rVar18.pointer_to_free_or_realloc = mesh.texcoords2;
  rVar18._16_8_ = (ulong)uStack_14c << 0x20;
  (*allocator_local.allocator_proc)(&allocator_local,rVar6,RF_AM_FREE,rVar18);
  rVar7.proc_name = "rf_unload_mesh";
  rVar7.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar7.line_in_file = 0x8200;
  rVar19.size_to_allocate_or_reallocate = 0;
  rVar19.pointer_to_free_or_realloc = mesh.indices;
  rVar19._16_8_ = (ulong)uStack_17c << 0x20;
  (*allocator_local.allocator_proc)(&allocator_local,rVar7,RF_AM_FREE,rVar19);
  rVar8.proc_name = "rf_unload_mesh";
  rVar8.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar8.line_in_file = 0x8202;
  rVar20.size_to_allocate_or_reallocate = 0;
  rVar20.pointer_to_free_or_realloc = mesh.anim_vertices;
  rVar20._16_8_ = (ulong)uStack_1ac << 0x20;
  (*allocator_local.allocator_proc)(&allocator_local,rVar8,RF_AM_FREE,rVar20);
  rVar9.proc_name = "rf_unload_mesh";
  rVar9.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar9.line_in_file = 0x8203;
  rVar21.size_to_allocate_or_reallocate = 0;
  rVar21.pointer_to_free_or_realloc = mesh.anim_normals;
  rVar21._16_8_ = (ulong)uStack_1dc << 0x20;
  (*allocator_local.allocator_proc)(&allocator_local,rVar9,RF_AM_FREE,rVar21);
  rVar10.proc_name = "rf_unload_mesh";
  rVar10.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar10.line_in_file = 0x8204;
  rVar22.size_to_allocate_or_reallocate = 0;
  rVar22.pointer_to_free_or_realloc = mesh.bone_weights;
  rVar22._16_8_ = (ulong)uStack_20c << 0x20;
  (*allocator_local.allocator_proc)(&allocator_local,rVar10,RF_AM_FREE,rVar22);
  rVar11.proc_name = "rf_unload_mesh";
  rVar11.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar11.line_in_file = 0x8205;
  rVar23.size_to_allocate_or_reallocate = 0;
  rVar23.pointer_to_free_or_realloc = mesh.bone_ids;
  rVar23._16_8_ = (ulong)uStack_23c << 0x20;
  (*allocator_local.allocator_proc)(&allocator_local,rVar11,RF_AM_FREE,rVar23);
  rVar12.proc_name = "rf_unload_mesh";
  rVar12.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar12.line_in_file = 0x8206;
  rVar24.size_to_allocate_or_reallocate = 0;
  rVar24.pointer_to_free_or_realloc = mesh.vbo_id;
  rVar24._16_8_ = (ulong)uStack_26c << 0x20;
  (*allocator_local.allocator_proc)(&allocator_local,rVar12,RF_AM_FREE,rVar24);
  return;
}

Assistant:

RF_API void rf_unload_mesh(rf_mesh mesh, rf_allocator allocator)
{
    rf_gfx_unload_mesh(mesh);

    RF_FREE(allocator, mesh.vertices);
    RF_FREE(allocator, mesh.texcoords);
    RF_FREE(allocator, mesh.normals);
    RF_FREE(allocator, mesh.colors);
    RF_FREE(allocator, mesh.tangents);
    RF_FREE(allocator, mesh.texcoords2);
    RF_FREE(allocator, mesh.indices);

    RF_FREE(allocator, mesh.anim_vertices);
    RF_FREE(allocator, mesh.anim_normals);
    RF_FREE(allocator, mesh.bone_weights);
    RF_FREE(allocator, mesh.bone_ids);
    RF_FREE(allocator, mesh.vbo_id);
}